

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPrivKeys
          (LegacyScriptPubKeyMan *this,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,int64_t timestamp)

{
  _Base_ptr *this_00;
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  size_t sVar6;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  _Base_ptr p_Var7;
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  *this_01;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> in_stack_ffffffffffffff50;
  string local_a0;
  CPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x70))
            (&stack0xffffffffffffff50,(long *)CONCAT44(extraout_var,iVar3),1);
  p_Var7 = &(privkey_map->_M_t)._M_impl.super__Rb_tree_header._M_header;
  this_01 = &(this->super_LegacyDataSPKM).mapKeyMetadata;
  for (p_Var5 = (privkey_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 != p_Var7; p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    this_00 = &p_Var5[1]._M_right;
    CKey::GetPubKey(&pubkey,(CKey *)this_00);
    bVar2 = CKey::VerifyPubKey((CKey *)this_00,&pubkey);
    if (!bVar2) {
      __assert_fail("key.VerifyPubKey(pubkey)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x65d,
                    "bool wallet::LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey> &, const int64_t)"
                   );
    }
    iVar3 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1d])
                      (this,p_Var5 + 1);
    if ((char)iVar3 == '\0') {
      pmVar4 = std::
               map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
               ::operator[](this_01,(key_type *)(p_Var5 + 1));
      pmVar4->nCreateTime = timestamp;
      bVar2 = AddKeyPubKeyWithDB(this,(WalletBatch *)&stack0xffffffffffffff50,(CKey *)this_00,
                                 &pubkey);
      if (!bVar2) break;
      UpdateTimeFirstKey(this,timestamp);
    }
    else {
      sVar6 = 0x21;
      if ((pubkey.vch[0] & 0xfe) != 2) {
        if ((byte)(pubkey.vch[0] - 4) < 4) {
          sVar6 = *(size_t *)(&DAT_006d3710 + (ulong)(byte)(pubkey.vch[0] - 4) * 8);
        }
        else {
          sVar6 = 0;
        }
      }
      s.m_size = sVar6;
      s.m_data = pubkey.vch;
      HexStr_abi_cxx11_(&local_a0,s);
      parameters._M_string_length = (size_type)p_Var7;
      parameters._M_dataplus._M_p = (pointer)timestamp;
      parameters.field_2._M_allocated_capacity = (size_type)this_01;
      parameters.field_2._8_8_ = in_stack_ffffffffffffff50._M_head_impl;
      ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                ((ScriptPubKeyMan *)this,"Already have key with pubkey %s, skipping\n",parameters);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  if (in_stack_ffffffffffffff50._M_head_impl != (DatabaseBatch *)0x0) {
    (**(code **)(*(long *)in_stack_ffffffffffffff50._M_head_impl + 0x28))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return p_Var5 == p_Var7;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey>& privkey_map, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : privkey_map) {
        const CKey& key = entry.second;
        CPubKey pubkey = key.GetPubKey();
        const CKeyID& id = entry.first;
        assert(key.VerifyPubKey(pubkey));
        // Skip if we already have the key
        if (HaveKey(id)) {
            WalletLogPrintf("Already have key with pubkey %s, skipping\n", HexStr(pubkey));
            continue;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;
        // If the private key is not present in the wallet, insert it.
        if (!AddKeyPubKeyWithDB(batch, key, pubkey)) {
            return false;
        }
        UpdateTimeFirstKey(timestamp);
    }
    return true;
}